

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm_fold.c
# Opt level: O0

int tryhash(uint32_t *htab,uint32_t sz,uint32_t r,int dorol)

{
  uint uVar1;
  byte bVar2;
  uint uVar3;
  byte bVar4;
  uint local_44;
  uint local_40;
  uint32_t h2;
  uint32_t k2;
  uint32_t h;
  uint32_t k;
  uint32_t key;
  uint32_t i;
  int dorol_local;
  uint32_t r_local;
  uint32_t sz_local;
  uint32_t *htab_local;
  
  if ((dorol == 0) || (((r & 0x1f) != 0 && (r >> 5 != 0)))) {
    memset(htab,0xff,(ulong)(sz + 1) << 2);
    for (k = 0; k < nkeys; k = k + 1) {
      uVar1 = foldkeys[k];
      uVar3 = uVar1 & 0xffffff;
      bVar2 = (byte)r;
      if (dorol == 0) {
        local_40 = (uVar3 << ((byte)(r >> 5) & 0x1f)) - uVar3 << (bVar2 & 0x1f);
      }
      else {
        bVar4 = -(char)(r >> 5) & 0x1f;
        local_40 = (uVar3 << ((byte)(r >> 5) & 0x1f) | uVar3 >> (-(char)(r >> 5) & 0x1fU)) - uVar3
                   << (bVar2 & 0x1f) |
                   (uVar3 << ((byte)(r >> 5) & 0x1f) | uVar3 >> bVar4) - uVar3 >>
                   ((char)(0 >> bVar4) - (bVar2 & 0x1f) & 0x1f);
      }
      local_40 = local_40 % sz;
      if (htab[local_40] == 0xffffffff) {
        htab[local_40] = uVar1;
      }
      else {
        if (htab[local_40 + 1] != 0xffffffff) {
          if ((sz - 1 <= local_40) || (htab[local_40 + 2] != 0xffffffff)) {
            return 0;
          }
          uVar3 = htab[local_40 + 1] & 0xffffff;
          if (dorol == 0) {
            local_44 = (uVar3 << ((byte)(r >> 5) & 0x1f)) - uVar3 << (bVar2 & 0x1f);
          }
          else {
            bVar4 = -(char)(r >> 5) & 0x1f;
            local_44 = (uVar3 << ((byte)(r >> 5) & 0x1f) | uVar3 >> (-(char)(r >> 5) & 0x1fU)) -
                       uVar3 << (bVar2 & 0x1f) |
                       (uVar3 << ((byte)(r >> 5) & 0x1f) | uVar3 >> bVar4) - uVar3 >>
                       ((char)(0 >> bVar4) - (bVar2 & 0x1f) & 0x1f);
          }
          if (local_44 % sz != local_40 + 1) {
            return 0;
          }
          htab[local_40 + 2] = htab[local_40 + 1];
        }
        htab[local_40 + 1] = uVar1;
      }
    }
    htab_local._4_4_ = 1;
  }
  else {
    htab_local._4_4_ = 0;
  }
  return htab_local._4_4_;
}

Assistant:

static int tryhash(uint32_t *htab, uint32_t sz, uint32_t r, int dorol)
{
  uint32_t i;
  if (dorol && ((r & 31) == 0 || (r>>5) == 0))
    return 0;  /* Avoid zero rotates. */
  memset(htab, 0xff, (sz+1)*sizeof(uint32_t));
  for (i = 0; i < nkeys; i++) {
    uint32_t key = foldkeys[i];
    uint32_t k = key & 0xffffff;
    uint32_t h = (dorol ? lj_rol(lj_rol(k, r>>5) - k, r&31) :
			  (((k << (r>>5)) - k) << (r&31))) % sz;
    if (htab[h] != 0xffffffff) {  /* Collision on primary slot. */
      if (htab[h+1] != 0xffffffff) {  /* Collision on secondary slot. */
	/* Try to move the colliding key, if possible. */
	if (h < sz-1 && htab[h+2] == 0xffffffff) {
	  uint32_t k2 = htab[h+1] & 0xffffff;
	  uint32_t h2 = (dorol ? lj_rol(lj_rol(k2, r>>5) - k2, r&31) :
				 (((k2 << (r>>5)) - k2) << (r&31))) % sz;
	  if (h2 != h+1) return 0;  /* Cannot resolve collision. */
	  htab[h+2] = htab[h+1];  /* Move colliding key to secondary slot. */
	} else {
	  return 0;  /* Collision. */
	}
      }
      htab[h+1] = key;
    } else {
      htab[h] = key;
    }
  }
  return 1;  /* Success, all keys could be stored. */
}